

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.c
# Opt level: O0

int16_t OPL3_EnvelopeCalcSin2(uint16_t phase,uint16_t envelope)

{
  int16_t iVar1;
  ushort local_e;
  uint16_t out;
  uint16_t envelope_local;
  uint16_t phase_local;
  
  if ((phase & 0x100) == 0) {
    local_e = logsinrom[(phase & 0x3ff) & 0xff];
  }
  else {
    local_e = logsinrom[(phase & 0x3ff) & 0xff ^ 0xff];
  }
  iVar1 = OPL3_EnvelopeCalcExp((uint)local_e + (uint)envelope * 8);
  return iVar1;
}

Assistant:

static int16_t OPL3_EnvelopeCalcSin2(uint16_t phase, uint16_t envelope)
{
    uint16_t out = 0;
    phase &= 0x3ff;
    if (phase & 0x100)
    {
        out = logsinrom[(phase & 0xffu) ^ 0xffu];
    }
    else
    {
        out = logsinrom[phase & 0xffu];
    }
    return OPL3_EnvelopeCalcExp(out + (envelope << 3));
}